

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_delta_qindex(MACROBLOCKD *xd,int delta_qindex,aom_writer *w)

{
  undefined8 in_RDX;
  int in_ESI;
  FRAME_CONTEXT *ec_ctx;
  int smallval;
  int thr;
  int rem_bits;
  int abs;
  int sign;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar1;
  undefined4 in_stack_ffffffffffffffc0;
  
  if (in_ESI < 0) {
    in_ESI = -in_ESI;
  }
  iVar1 = in_ESI;
  if (2 < in_ESI) {
    iVar1 = 3;
  }
  aom_write_symbol((aom_writer *)CONCAT44(in_ESI,in_stack_ffffffffffffffc0),
                   (int)((ulong)in_RDX >> 0x20),
                   (aom_cdf_prob *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
  if (2 < in_ESI) {
    get_msb(in_ESI - 1);
    aom_write_literal((aom_writer *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    aom_write_literal((aom_writer *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  }
  if (0 < in_ESI) {
    aom_write_bit((aom_writer *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac)
    ;
  }
  return;
}

Assistant:

static inline void write_delta_qindex(const MACROBLOCKD *xd, int delta_qindex,
                                      aom_writer *w) {
  int sign = delta_qindex < 0;
  int abs = sign ? -delta_qindex : delta_qindex;
  int rem_bits, thr;
  int smallval = abs < DELTA_Q_SMALL ? 1 : 0;
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;

  aom_write_symbol(w, AOMMIN(abs, DELTA_Q_SMALL), ec_ctx->delta_q_cdf,
                   DELTA_Q_PROBS + 1);

  if (!smallval) {
    rem_bits = get_msb(abs - 1);
    thr = (1 << rem_bits) + 1;
    aom_write_literal(w, rem_bits - 1, 3);
    aom_write_literal(w, abs - thr, rem_bits);
  }
  if (abs > 0) {
    aom_write_bit(w, sign);
  }
}